

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3_result_text64
               (sqlite3_context *pCtx,char *z,sqlite3_uint64 n,_func_void_void_ptr *xDel,uchar enc)

{
  uchar local_29;
  uchar enc_local;
  _func_void_void_ptr *xDel_local;
  sqlite3_uint64 n_local;
  char *z_local;
  sqlite3_context *pCtx_local;
  
  local_29 = enc;
  xDel_local = (_func_void_void_ptr *)n;
  if (enc != '\x01') {
    if (enc == '\x04') {
      local_29 = '\x02';
    }
    xDel_local = (_func_void_void_ptr *)(n & 0xfffffffffffffffe);
  }
  if (xDel_local < (_func_void_void_ptr *)0x80000000) {
    setResultStrOrError(pCtx,z,(int)xDel_local,local_29,xDel);
    sqlite3VdbeMemZeroTerminateIfAble(pCtx->pOut);
  }
  else {
    invokeValueDestructor(z,xDel,pCtx);
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_result_text64(
  sqlite3_context *pCtx,
  const char *z,
  sqlite3_uint64 n,
  void (*xDel)(void *),
  unsigned char enc
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ){
    invokeValueDestructor(z, xDel, 0);
    return;
  }
#endif
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  assert( xDel!=SQLITE_DYNAMIC );
  if( enc!=SQLITE_UTF8 ){
    if( enc==SQLITE_UTF16 ) enc = SQLITE_UTF16NATIVE;
    n &= ~(u64)1;
  }
  if( n>0x7fffffff ){
    (void)invokeValueDestructor(z, xDel, pCtx);
  }else{
    setResultStrOrError(pCtx, z, (int)n, enc, xDel);
    sqlite3VdbeMemZeroTerminateIfAble(pCtx->pOut);
  }
}